

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

void xmlACatalogDump(xmlCatalogPtr catal,FILE *out)

{
  FILE *out_local;
  xmlCatalogPtr catal_local;
  
  if ((out != (FILE *)0x0) && (catal != (xmlCatalogPtr)0x0)) {
    if (catal->type == XML_XML_CATALOG_TYPE) {
      xmlDumpXMLCatalog(out,catal->xml);
    }
    else {
      xmlHashScan(catal->sgml,xmlCatalogDumpEntry,out);
    }
  }
  return;
}

Assistant:

void
xmlACatalogDump(xmlCatalogPtr catal, FILE *out) {
    if ((out == NULL) || (catal == NULL))
	return;

    if (catal->type == XML_XML_CATALOG_TYPE) {
	xmlDumpXMLCatalog(out, catal->xml);
    } else {
	xmlHashScan(catal->sgml, xmlCatalogDumpEntry, out);
    }
}